

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O1

void test_multiple_syncs(rtr_socket *socket)

{
  int iVar1;
  int iVar2;
  size_t i;
  long lVar3;
  long lVar4;
  int *piVar5;
  uint32_t sn;
  uint32_t sn_00;
  undefined1 *puVar6;
  int *piVar7;
  uint16_t in_SI;
  uint16_t uVar8;
  uint uVar9;
  aspa_record *records;
  size_t in_R8;
  ulong uVar10;
  int iVar11;
  long in_FS_OFFSET;
  int local_22b8 [8];
  undefined1 local_2298 [8264];
  undefined8 uStack_250;
  undefined1 auStack_248 [8];
  ulong local_240;
  ulong local_238;
  size_t local_230;
  undefined1 *local_228;
  long local_220;
  int *local_218;
  rtr_socket *local_210;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  undefined1 *local_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  undefined4 local_1dc;
  uint local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined1 local_1b8 [8];
  update_callback _callbacks850 [3];
  int local_138;
  int local_134;
  int local_130;
  uint local_12c;
  undefined4 local_128;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  aspa_record _records821 [2];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  update_callback _callbacks813 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_250 = 0x106910;
  begin_cache_response((uint8_t)socket,in_SI);
  local_48 = 0x300000002;
  uStack_40 = 0x500000004;
  uStack_250 = 0x106937;
  append_aspa('\x01','\x01',(uint32_t)&local_48,(uint32_t *)0x4,in_R8);
  _callbacks813[1].type = 3;
  _callbacks813[1]._33_7_ = 0x4000000;
  uVar8 = 2;
  uStack_250 = 0x106959;
  append_aspa('\x01','\x02',(int)_callbacks813 + 0x48,(uint32_t *)0x4,in_R8);
  uStack_250 = 0x106963;
  end_cache_response(0xb5,uVar8,sn);
  expected_callbacks = (update_callback *)local_a8;
  local_a8 = (undefined1  [8])0x0;
  _callbacks813[0].source._0_4_ = 1;
  _callbacks813[0].record.customer_asn = 4;
  _callbacks813[0].record._4_4_ = 0;
  _callbacks813[0].record.provider_count = (size_t)&local_b8;
  local_b8 = 0x300000002;
  uStack_b0 = 0x500000004;
  _callbacks813[0].record.provider_asns._0_1_ = 1;
  _callbacks813[0].type = ASPA_REMOVE;
  _callbacks813[0]._33_7_ = 0;
  _callbacks813[1].source._0_4_ = 2;
  _callbacks813[1].record.customer_asn = 4;
  _callbacks813[1].record._4_4_ = 0;
  _callbacks813[1].record.provider_count = (size_t)&_records821[1].provider_asns;
  _records821[1].provider_asns = (uint32_t *)0x400000003;
  _callbacks813[1].record.provider_asns._0_1_ = 1;
  callback_count = 2;
  callback_index = 0;
  uStack_250 = 0x1069dc;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    uStack_250 = 0x106e48;
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x32f,"void test_multiple_syncs(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    records = (aspa_record *)local_f8;
    local_f8._0_4_ = 1;
    _records821[0].customer_asn = 4;
    _records821[0]._4_4_ = 0;
    _records821[0].provider_count = (size_t)&local_108;
    local_108 = 0x300000002;
    uStack_100 = 0x500000004;
    _records821[0].provider_asns._0_4_ = 2;
    _records821[1].customer_asn = 4;
    _records821[1]._4_4_ = 0;
    _records821[1].provider_count = (size_t)&local_118;
    local_118 = 0x400000003;
    uStack_110 = 0x600000005;
    uStack_250 = 0x106a57;
    local_210 = socket;
    assert_table(socket,records,2);
    piVar5 = local_22b8;
    lVar3 = 0;
    do {
      piVar5[lVar3] = (int)lVar3 + 3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    puVar6 = local_2298;
    iVar11 = 5;
    lVar3 = 0x48;
    local_1f4 = 2;
    iVar1 = 4;
    piVar7 = piVar5;
    uVar10 = 1;
    local_228 = auStack_248;
    while( true ) {
      local_1f0 = (undefined1 *)(uVar10 * 2);
      local_204 = (int)local_1f0 + 1;
      piVar7[-2] = 0x106ac5;
      piVar7[-1] = 0;
      local_218 = piVar5;
      begin_cache_response((uint8_t)socket,(uint16_t)records);
      iVar2 = (int)uVar10;
      piVar7[-2] = 0x106ad3;
      piVar7[-1] = 0;
      append_aspa('\0',(uint8_t)uVar10,0,(uint32_t *)0x0,in_R8);
      local_220 = uVar10 * 2 + 2;
      local_128 = (undefined4)local_220;
      local_1fc = (int)local_1f0;
      local_1f8 = local_1fc + 3;
      local_200 = local_1fc + 4;
      local_1fc = local_1fc + 5;
      piVar7[-2] = 0x106b38;
      piVar7[-1] = 0;
      local_124 = local_1f8;
      local_120 = local_200;
      local_11c = local_1fc;
      append_aspa('\x01',(uint8_t)local_204,(uint32_t)&local_128,(uint32_t *)0x4,in_R8);
      local_138 = local_1f8;
      local_134 = local_200;
      local_130 = local_1fc;
      local_12c = (int)local_1f0 + 6;
      local_1f0 = (undefined1 *)(ulong)local_12c;
      uVar8 = (uint16_t)local_220;
      piVar7[-2] = 0x106b90;
      piVar7[-1] = 0;
      append_aspa('\x01',(uint8_t)local_220,(uint32_t)&local_138,(uint32_t *)0x4,in_R8);
      piVar7[-2] = 0x106b9a;
      piVar7[-1] = 0;
      end_cache_response(0xbc,uVar8,sn_00);
      local_238 = uVar10 + 1;
      local_1c8 = (undefined4)local_238;
      local_230 = uVar10 + 2;
      local_1c4 = (undefined4)local_230;
      local_1c0 = iVar2 + 3;
      local_1bc = iVar2 + 4;
      local_1b8 = (undefined1  [8])0x0;
      _callbacks850[0].record.customer_asn = 4;
      _callbacks850[0].record._4_4_ = 0;
      _callbacks850[0].record.provider_count = (size_t)&local_1c8;
      _callbacks850[0].record.provider_asns._0_1_ = 0;
      _callbacks850[0].type = ASPA_REMOVE;
      _callbacks850[0]._33_7_ = 0;
      _callbacks850[1].source._0_4_ = local_204;
      uVar9 = (uint)local_220;
      local_1d4 = local_1f8;
      local_1e8 = local_1f8;
      local_1d0 = local_200;
      local_1e4 = local_200;
      local_1cc = local_1fc;
      local_1e0 = local_1fc;
      local_1dc = SUB84(local_1f0,0);
      _callbacks850[1].record.customer_asn = 4;
      _callbacks850[1].record._4_4_ = 0;
      _callbacks850[1].record.provider_count = (size_t)&local_1d8;
      _callbacks850[1].record.provider_asns._0_1_ = 1;
      _callbacks850[1].type = ASPA_REMOVE;
      _callbacks850[1]._33_7_ = 0;
      _callbacks850[2].record.customer_asn = 4;
      _callbacks850[2].record._4_4_ = 0;
      _callbacks850[2].record.provider_count = (size_t)&local_1e8;
      _callbacks850[2].record.provider_asns._0_1_ = 1;
      expected_callbacks = (update_callback *)local_1b8;
      callback_count = 3;
      callback_index = 0;
      piVar7[-2] = 0x106cdf;
      piVar7[-1] = 0;
      local_240 = uVar10;
      local_1d8 = uVar9;
      _callbacks850[0].source._0_4_ = iVar2;
      _callbacks850[2].source._0_4_ = uVar9;
      iVar2 = rtr_sync(local_210);
      if (iVar2 != 0) {
        piVar7[-2] = 0x106e29;
        piVar7[-1] = 0;
        __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x353,"void test_multiple_syncs(struct rtr_socket *)");
      }
      if (callback_index != callback_count) break;
      lVar4 = 0;
      do {
        *(int *)(puVar6 + lVar4 * 4 + -0x10) = iVar1 + (int)lVar4;
        *(int *)(puVar6 + lVar4 * 4) = iVar11 + (int)lVar4;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      records = (aspa_record *)((long)piVar7 - (local_230 * 0x18 + 0xf & 0xfffffffffffffff0));
      if (local_240 < (uVar9 & 0xfffffffe)) {
        lVar4 = 0;
        piVar5 = local_218;
        iVar2 = local_1f4;
        do {
          *(int *)((long)&records->customer_asn + lVar4) = iVar2;
          *(undefined8 *)((long)&records->provider_count + lVar4) = 4;
          *(int **)((long)&records->provider_asns + lVar4) = piVar5;
          lVar4 = lVar4 + 0x18;
          iVar2 = iVar2 + 1;
          piVar5 = piVar5 + 4;
        } while (lVar3 != lVar4);
      }
      records[-1].provider_asns = (uint32_t *)0x106d84;
      socket = local_210;
      local_1f0 = (undefined1 *)piVar7;
      assert_table(local_210,records,local_230);
      iVar11 = iVar11 + 2;
      puVar6 = puVar6 + 0x20;
      iVar1 = iVar1 + 2;
      lVar3 = lVar3 + 0x18;
      local_1f4 = local_1f4 + 1;
      piVar5 = local_218 + 4;
      piVar7 = (int *)local_1f0;
      uVar10 = local_238;
      if (local_238 == 0x104) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        *(code **)(local_228 + -8) = test_many_pdus;
        __stack_chk_fail();
      }
    }
    piVar7[-2] = 0x106e0a;
    piVar7[-1] = 0;
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x354,"void test_multiple_syncs(struct rtr_socket *)");
  }
  uStack_250 = 0x106e67;
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x330,"void test_multiple_syncs(struct rtr_socket *)");
}

Assistant:

static void test_multiple_syncs(struct rtr_socket *socket)
{
	const size_t PROVIDER_COUNT = 4;
	// amount of ASPAs to be withdrawn (twice as much are added)
	const size_t N = 256 + 4;

	// initial cycle: add two new aspas
	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1, ASNS(2, 3, 4, 5));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 2, ASNS(3, 4, 5, 6));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1, ASNS(2, 3, 4, 5))),
		ADDED(RECORD(2, ASNS(3, 4, 5, 6))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1, ASNS(2, 3, 4, 5)),
		RECORD(2, ASNS(3, 4, 5, 6)),
	);

	// repeated cycle: withdraw one, announce two new
	// store expected provider asns, starting with providers for c_an = 2
	uint32_t provider_asns[(2 * N - 1) * PROVIDER_COUNT];

	// enter provider_asns for ASPA record 2 => {3, 4, 5, 6}
	for (size_t i = 0; i < PROVIDER_COUNT; i++)
		provider_asns[i] = i + 3;

	// customer asn to be withdrawn
	for (uint32_t c_wd = 1; c_wd < N; c_wd++) {
		// first customer asn to be announced
		uint32_t c_an = 2 * c_wd + 1;

		begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, c_wd,
			ASNS());
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, c_an,
			ASNS(c_an + 1, c_an + 2, c_an + 3, c_an + 4));
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, c_an + 1,
			ASNS(c_an + 2, c_an + 3, c_an + 4, c_an + 5));

		end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

		EXPECT_UPDATE_CALLBACKS(
			REMOVED(RECORD(c_wd, ASNS(c_wd + 1, c_wd + 2, c_wd + 3, c_wd + 4))),
			ADDED(RECORD(c_an, ASNS(c_an + 1, c_an + 2, c_an + 3, c_an + 4))),
			ADDED(RECORD(c_an + 1, ASNS(c_an + 2, c_an + 3, c_an + 4, c_an + 5))),
		);
		assert(rtr_sync(socket) == RTR_SUCCESS);
		assert(callback_index == callback_count);

		// store announced ASPAs' providers for validation
		for (size_t i = 0; i < PROVIDER_COUNT; i++) {
			provider_asns[PROVIDER_COUNT * (size_t)(c_an - 2) + i] = c_an + (uint32_t)i + 1;
			provider_asns[PROVIDER_COUNT * (size_t)(c_an - 1) + i] = c_an + (uint32_t)i + 2;
		}

		// build array of all records expected to be in aspa_table
		// (customer asns after last withdrawn until including last announced)
		size_t record_count = c_wd + 2;
		struct aspa_record records[record_count];

		for (size_t c_ex = c_wd + 1; c_ex <= c_an + 1; c_ex++) {
			records[c_ex - (c_wd + 1)] =
				((struct aspa_record) {
					.customer_asn = (uint32_t)c_ex,
					.provider_count = PROVIDER_COUNT,
					.provider_asns = &provider_asns[PROVIDER_COUNT * (c_ex - 2)]
				});
		}
		assert_table(socket, records, record_count);
	}
}